

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

int food_detect(obj *sobj,boolean *scr_known)

{
  boolean bVar1;
  xchar xVar2;
  xchar xVar3;
  undefined1 uVar4;
  level *plVar5;
  byte bVar6;
  obj *poVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char oclass;
  monst *pmVar11;
  int iVar12;
  obj *poVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  char buf [256];
  char local_138 [264];
  
  uVar4 = u._1052_1_;
  iVar12 = 0;
  bVar15 = false;
  if (u.uprops[0x1c].intrinsic == 0) {
    if (sobj == (obj *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = (sobj->field_0x4a & 1) == 0;
    }
  }
  oclass = '\b' - bVar15;
  pcVar9 = "something";
  if (bVar15 != false) {
    pcVar9 = "food";
  }
  bVar6 = clear_stale_map('\b' - bVar15,0);
  plVar5 = level;
  xVar3 = u.uy;
  xVar2 = u.ux;
  poVar13 = level->objlist;
  if (poVar13 == (obj *)0x0) {
    bVar16 = false;
  }
  else {
    iVar12 = 0;
    iVar14 = 0;
    do {
      poVar7 = o_in(poVar13,oclass);
      if (poVar7 != (obj *)0x0) {
        if ((poVar13->ox == xVar2) && (poVar13->oy == xVar3)) {
          iVar14 = iVar14 + 1;
        }
        else {
          iVar12 = iVar12 + 1;
        }
      }
      poVar13 = poVar13->nobj;
    } while (poVar13 != (obj *)0x0);
    bVar16 = iVar14 != 0;
  }
  pmVar11 = plVar5->monlist;
  bVar17 = iVar12 != 0;
  if (pmVar11 != (monst *)0x0 && !bVar17) {
    do {
      poVar13 = (obj *)&pmVar11->minvent;
      do {
        poVar13 = poVar13->nobj;
        if (poVar13 == (obj *)0x0) goto LAB_00160465;
        poVar7 = o_in(poVar13,oclass);
      } while (poVar7 == (obj *)0x0);
      iVar12 = 1;
LAB_00160465:
      pmVar11 = pmVar11->nmon;
      bVar17 = iVar12 != 0;
    } while ((pmVar11 != (monst *)0x0) && (iVar12 == 0));
  }
  if ((bool)(bVar16 | bVar17)) {
    *scr_known = '\x01';
    if (!bVar17) {
      pcVar8 = "smell";
      if (sobj == (obj *)0x0) {
        pcVar8 = "sense";
      }
      pline("You %s %s nearby.",pcVar8,pcVar9);
      if (sobj == (obj *)0x0) {
        return 0;
      }
      if ((sobj->field_0x4a & 2) == 0) {
        return 0;
      }
      if ((u._1052_1_ & 0x40) == 0) {
        pcVar9 = body_part(0x11);
        pline("Your %s starts to tingle.",pcVar9);
      }
      u._1052_1_ = u._1052_1_ | 0x40;
      return 0;
    }
    cls();
    u._1052_1_ = u._1052_1_ & 0xfd;
    for (poVar13 = level->objlist; poVar13 != (obj *)0x0; poVar13 = poVar13->nobj) {
      poVar7 = o_in(poVar13,oclass);
      if (poVar7 != (obj *)0x0) {
        if (poVar7 != poVar13) {
          poVar7->ox = poVar13->ox;
          poVar7->oy = poVar13->oy;
        }
        map_object(poVar7,1);
      }
    }
    pmVar11 = level->monlist;
    do {
      if (pmVar11 == (monst *)0x0) {
        newsym((int)u.ux,(int)u.uy);
        if (sobj == (obj *)0x0) {
          pline("You sense %s.",pcVar9);
        }
        else {
          bVar6 = sobj->field_0x4a;
          pcVar8 = body_part(0x11);
          if ((bVar6 & 2) == 0) {
            pline("Your %s tingles and you smell %s.",pcVar8,pcVar9);
          }
          else {
            pcVar10 = "continues";
            if ((u._1052_1_ & 0x40) == 0) {
              pcVar10 = "starts";
            }
            pline("Your %s %s to tingle and you smell %s.",pcVar8,pcVar10,pcVar9);
            u._1052_1_ = u._1052_1_ | 0x40;
          }
        }
        (*windowprocs.win_pause)(P_MAP);
        exercise(2,'\x01');
        doredraw();
        u._1052_1_ = u._1052_1_ & 0xfd | uVar4 & 2;
        if ((uVar4 & 2) != 0) {
          under_water(2);
        }
        if ((u._1052_1_ & 0x20) == 0) {
          return 0;
        }
        under_ground(2);
        return 0;
      }
      poVar13 = (obj *)&pmVar11->minvent;
      do {
        poVar13 = poVar13->nobj;
        if (poVar13 == (obj *)0x0) goto LAB_0016054f;
        poVar7 = o_in(poVar13,oclass);
      } while (poVar7 == (obj *)0x0);
      poVar7->ox = pmVar11->mx;
      poVar7->oy = pmVar11->my;
      map_object(poVar7,1);
LAB_0016054f:
      pmVar11 = pmVar11->nmon;
    } while( true );
  }
  *scr_known = bVar15 & bVar6 != 0;
  if (bVar6 == 0) {
    if (sobj == (obj *)0x0) goto LAB_00160746;
    pcVar9 = body_part(0x11);
    pcVar8 = " then starts to tingle";
    if ((u._1052_1_ & 0x40) != 0) {
      pcVar8 = "";
    }
    if ((sobj->field_0x4a & 2) == 0) {
      pcVar8 = "";
    }
    sprintf(local_138,"Your %s twitches%s.",pcVar9,pcVar8);
    bVar1 = flags.beginner;
    if (((sobj->field_0x4a & 2) == 0) || ((u._1052_1_ & 0x40) != 0)) {
      strange_feeling(sobj,local_138);
      goto LAB_00160746;
    }
    flags.beginner = '\0';
    strange_feeling(sobj,local_138);
    flags.beginner = bVar1;
  }
  else {
    doredraw();
    pline("You sense a lack of %s nearby.",pcVar9);
    if ((sobj == (obj *)0x0) || ((sobj->field_0x4a & 2) == 0)) goto LAB_00160746;
    if ((u._1052_1_ & 0x40) == 0) {
      pcVar9 = body_part(0x11);
      pline("Your %s starts to tingle.",pcVar9);
    }
  }
  u._1052_1_ = u._1052_1_ | 0x40;
LAB_00160746:
  return (uint)(bVar6 ^ 1);
}

Assistant:

int food_detect(struct obj *sobj, boolean *scr_known)
{
    struct obj *obj;
    struct monst *mtmp;
    int ct = 0, ctu = 0;
    boolean confused = (Confusion || (sobj && sobj->cursed)), stale;
    char oclass = confused ? POTION_CLASS : FOOD_CLASS;
    const char *what = confused ? "something" : "food";
    int uw = u.uinwater;

    stale = clear_stale_map(oclass, 0);

    for (obj = level->objlist; obj; obj = obj->nobj)
	if (o_in(obj, oclass)) {
	    if (obj->ox == u.ux && obj->oy == u.uy) ctu++;
	    else ct++;
	}
    for (mtmp = level->monlist; mtmp && !ct; mtmp = mtmp->nmon) {
	/* no DEADMONSTER(mtmp) check needed since dmons never have inventory */
	for (obj = mtmp->minvent; obj; obj = obj->nobj)
	    if (o_in(obj, oclass)) {
		ct++;
		break;
	    }
    }
    
    if (!ct && !ctu) {
	*scr_known = stale && !confused;
	if (stale) {
	    doredraw();
	    pline("You sense a lack of %s nearby.", what);
	    if (sobj && sobj->blessed) {
		if (!u.uedibility) pline("Your %s starts to tingle.", body_part(NOSE));
		u.uedibility = 1;
	    }
	} else if (sobj) {
	    char buf[BUFSZ];
	    sprintf(buf, "Your %s twitches%s.", body_part(NOSE),
			(sobj->blessed && !u.uedibility) ? " then starts to tingle" : "");
	    if (sobj->blessed && !u.uedibility) {
		boolean savebeginner = flags.beginner;	/* prevent non-delivery of */
		flags.beginner = FALSE;			/* 	message            */
		strange_feeling(sobj, buf);
		flags.beginner = savebeginner;
		u.uedibility = 1;
	    } else
		strange_feeling(sobj, buf);
	}
	return !stale;
    } else if (!ct) {
	*scr_known = TRUE;
	pline("You %s %s nearby.", sobj ? "smell" : "sense", what);
	if (sobj && sobj->blessed) {
		if (!u.uedibility) pline("Your %s starts to tingle.", body_part(NOSE));
		u.uedibility = 1;
	}
    } else {
	struct obj *temp;
	*scr_known = TRUE;
	cls();
	u.uinwater = 0;
	for (obj = level->objlist; obj; obj = obj->nobj)
	    if ((temp = o_in(obj, oclass)) != 0) {
		if (temp != obj) {
		    temp->ox = obj->ox;
		    temp->oy = obj->oy;
		}
		map_object(temp,1);
	    }
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    /* no DEADMONSTER(mtmp) check needed since dmons never have inventory */
	    for (obj = mtmp->minvent; obj; obj = obj->nobj)
		if ((temp = o_in(obj, oclass)) != 0) {
		    temp->ox = mtmp->mx;
		    temp->oy = mtmp->my;
		    map_object(temp,1);
		    break;	/* skip rest of this monster's inventory */
		}
	newsym(u.ux,u.uy);
	if (sobj) {
	    if (sobj->blessed) {
	    	pline("Your %s %s to tingle and you smell %s.", body_part(NOSE),
	    		u.uedibility ? "continues" : "starts", what);
		u.uedibility = 1;
	    } else
		pline("Your %s tingles and you smell %s.", body_part(NOSE), what);
	}
	else pline("You sense %s.", what);
	win_pause_output(P_MAP);
	exercise(A_WIS, TRUE);
	doredraw();
	u.uinwater = uw;
	if (Underwater) under_water(2);
	if (u.uburied) under_ground(2);
    }
    return 0;
}